

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O2

void Sat_SolverWriteDimacs
               (sat_solver *p,char *pFileName,lit *assumpBegin,lit *assumpEnd,int incrementVars)

{
  ulong uVar1;
  FILE *__stream;
  clause *pC;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)p->size;
  if (p->size < 1) {
    uVar1 = uVar2;
  }
  iVar5 = 0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if (p->levels[uVar2] == 0) {
      iVar5 = iVar5 + (uint)(p->assigns[uVar2] != '\x03');
    }
  }
  __stream = _stdout;
  if (pFileName != (char *)0x0) {
    __stream = fopen(pFileName,"wb");
  }
  if (__stream == (FILE *)0x0) {
    puts("Sat_SolverWriteDimacs(): Cannot open the ouput file.");
    return;
  }
  fprintf(__stream,"p cnf %d %d\n",(ulong)(uint)p->size,
          (ulong)(((int)((ulong)((long)assumpEnd - (long)assumpBegin) >> 2) + iVar5 +
                   (p->Mem).nEntries[0] + (p->Mem).nEntries[1]) - 1));
  for (lVar6 = 0; lVar6 <= (p->Mem).iPage[0]; lVar6 = lVar6 + 2) {
    iVar5 = 2;
    while ((iVar5 < *(p->Mem).pPages[lVar6] &&
           (pC = Sat_MemClause(&p->Mem,(int)lVar6,iVar5), pC != (clause *)0x0))) {
      if ((lVar6 != 0) || (iVar5 != 2)) {
        Sat_SolverClauseWriteDimacs((FILE *)__stream,pC,incrementVars);
      }
      iVar5 = iVar5 + (((uint)*pC & 1) + ((uint)*pC >> 0xb) + 2 & 0xfffffffe);
    }
  }
  pcVar4 = " 0";
  if (incrementVars == 0) {
    pcVar4 = "";
  }
  for (lVar6 = 0; lVar6 < p->size; lVar6 = lVar6 + 1) {
    if ((p->levels[lVar6] == 0) && (p->assigns[lVar6] != '\x03')) {
      pcVar3 = "-";
      if (p->assigns[lVar6] != '\x01') {
        pcVar3 = "";
      }
      fprintf(__stream,"%s%d%s\n",pcVar3,(ulong)((uint)(0 < incrementVars) + (int)lVar6),pcVar4);
    }
  }
  if (assumpBegin != (lit *)0x0) {
    for (; assumpBegin != assumpEnd; assumpBegin = (lit *)((uint *)assumpBegin + 1)) {
      pcVar3 = "-";
      if ((*assumpBegin & 1U) == 0) {
        pcVar3 = "";
      }
      fprintf(__stream,"%s%d%s\n",pcVar3,(ulong)((*assumpBegin >> 1) + (uint)(0 < incrementVars)),
              pcVar4);
    }
  }
  fputc(10,__stream);
  if (pFileName == (char *)0x0) {
    return;
  }
  fclose(__stream);
  return;
}

Assistant:

void Sat_SolverWriteDimacs( sat_solver * p, char * pFileName, lit* assumpBegin, lit* assumpEnd, int incrementVars )
{
    Sat_Mem_t * pMem = &p->Mem;
    FILE * pFile;
    clause * c;
    int i, k, nUnits;

    // count the number of unit clauses
    nUnits = 0;
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 )
            nUnits++;

    // start the file
    pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    if ( pFile == NULL )
    {
        printf( "Sat_SolverWriteDimacs(): Cannot open the ouput file.\n" );
        return;
    }
//    fprintf( pFile, "c CNF generated by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "p cnf %d %d\n", p->size, Sat_MemEntryNum(&p->Mem, 0)-1+Sat_MemEntryNum(&p->Mem, 1)+nUnits+(int)(assumpEnd-assumpBegin) );

    // write the original clauses
    Sat_MemForEachClause( pMem, c, i, k )
        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write the learned clauses
//    Sat_MemForEachLearned( pMem, c, i, k )
//        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write zero-level assertions
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 ) // varX
            fprintf( pFile, "%s%d%s\n",
                     (p->assigns[i] == 1)? "-": "",    // var0
                     i + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");

    // write the assump
    if (assumpBegin) {
        for (; assumpBegin != assumpEnd; assumpBegin++) {
            fprintf( pFile, "%s%d%s\n",
                     lit_sign(*assumpBegin)? "-": "",
                     lit_var(*assumpBegin) + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");
        }
    }

    fprintf( pFile, "\n" );
    if ( pFileName ) fclose( pFile );
}